

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::serializer(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,output_adapter_t<char> *s,char ichar)

{
  char cVar1;
  lconv *plVar2;
  string *this_00;
  undefined1 in_DL;
  long in_RDI;
  shared_ptr<nlohmann::detail::output_adapter_protocol<char>_> *in_stack_ffffffffffffff88;
  shared_ptr<nlohmann::detail::output_adapter_protocol<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_49;
  undefined1 local_39;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = in_DL;
  std::shared_ptr<nlohmann::detail::output_adapter_protocol<char>_>::shared_ptr
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  memset((void *)(in_RDI + 0x10),0,0x40);
  plVar2 = localeconv();
  *(lconv **)(in_RDI + 0x50) = plVar2;
  if (*(long *)(*(long *)(in_RDI + 0x50) + 8) == 0) {
    local_39 = 0;
  }
  else {
    local_39 = **(undefined1 **)(*(long *)(in_RDI + 0x50) + 8);
  }
  *(undefined1 *)(in_RDI + 0x58) = local_39;
  if (**(long **)(in_RDI + 0x50) == 0) {
    local_49 = 0;
  }
  else {
    local_49 = *(undefined1 *)**(undefined8 **)(in_RDI + 0x50);
  }
  *(undefined1 *)(in_RDI + 0x59) = local_49;
  memset((void *)(in_RDI + 0x5a),0,0x200);
  *(undefined1 *)(in_RDI + 0x25a) = local_11;
  this_00 = (string *)(in_RDI + 0x260);
  cVar1 = *(char *)(in_RDI + 0x25a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,0x200,cVar1,&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  return;
}

Assistant:

serializer(output_adapter_t<char> s, const char ichar)
        : o(std::move(s)), loc(std::localeconv()),
          thousands_sep(loc->thousands_sep == nullptr ? '\0' : * (loc->thousands_sep)),
          decimal_point(loc->decimal_point == nullptr ? '\0' : * (loc->decimal_point)),
          indent_char(ichar), indent_string(512, indent_char)
    {}